

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int aec_decode_enable_offsets(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  vector_t *pvVar2;
  internal_state_conflict *state;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  if (piVar1->offsets == (vector_t *)0x0) {
    pvVar2 = vector_create();
    piVar1->offsets = pvVar2;
    vector_push_back(piVar1->offsets,0);
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -5;
  }
  return strm_local._4_4_;
}

Assistant:

int aec_decode_enable_offsets(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    if (state->offsets != NULL) {
        return AEC_RSI_OFFSETS_ERROR;
    }
    state->offsets = vector_create();
    vector_push_back(state->offsets, 0);
    return AEC_OK;
}